

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint sel;
  uint uVar6;
  undefined4 in_register_0000003c;
  int unaff_R15D;
  
  iVar4 = zvgFrameOpen(CONCAT44(in_register_0000003c,argc));
  if (iVar4 == 0) {
    zvgBanner(&ZvgSpeeds,&ZvgID);
    fputs("\n\nPress any key to continue...",_stdout);
    fflush(_stdout);
    fgetc(_stdin);
    init_zvgtweak();
    wattrset(_stdscr,0x100);
    initscr();
    displayMenu();
    Param[0].value = (int)DAT_001060e1;
    Param[1].value = (int)DAT_001060e2;
    Param[6].value = (int)DAT_001060e3;
    Param[7].value = (int)DAT_001060e4;
    Param[2].value = (int)DAT_001060e6;
    Param[3].value = (int)DAT_001060e5;
    Param[4].value = (int)ZvgMon;
    Param[5].value = (int)DAT_001060e7;
    uVar6 = 0xffffffff;
    pParamAll(-1);
    tmrSetFrameRate(0x3c);
    sel = 0;
    do {
      drawDisplay();
      uVar2 = uVar6;
      if ((uVar6 != sel) &&
         (pParam(Param + (int)sel,0x200,' ',' '), uVar2 = sel, uVar6 != 0xffffffff)) {
        pParam(Param + (int)uVar6,0x100,' ',' ');
      }
      uVar6 = uVar2;
      if ((0 < unaff_R15D) && (unaff_R15D = unaff_R15D + -1, unaff_R15D == 0)) {
        wmove(_stdscr,0x18,1);
        wclrtoeol(_stdscr);
        unaff_R15D = 0;
      }
      iVar4 = wgetch();
      bVar1 = false;
      uVar5 = (ulong)(iVar4 - 0x49U);
      bVar3 = false;
      if (iVar4 - 0x49U < 0x2b) {
        if ((0x100000001U >> (uVar5 & 0x3f) & 1) == 0) {
          if ((0x800000008U >> (uVar5 & 0x3f) & 1) == 0) {
            if ((0x40000000400U >> (uVar5 & 0x3f) & 1) == 0) goto code_r0x00102d83;
            zvgDmaPutc(0xea);
            pMsg(" Current values saved to EEPROM. ");
            unaff_R15D = 0xf0;
            goto LAB_00102dec;
          }
          zvgDmaPutc(0xeb);
          pMsg(" Monitor values re-loaded from EEPROM. ");
          wattrset(_stdscr,0x100);
        }
        else {
          zvgDmaPutc(0xed);
          pMsg(" Monitor values initialized to factory defaults. ");
        }
        unaff_R15D = 0xf0;
        bVar3 = true;
LAB_00102dec:
        bVar1 = bVar3;
        if (((iVar4 == 0x1b) || (iVar4 == 0x58)) || (iVar4 == 0x78)) {
          zvgFrameClose();
          initscr();
          goto LAB_00102f26;
        }
      }
      else {
code_r0x00102d83:
        switch(iVar4) {
        case 0x102:
          sel = sel + (sel < 7);
          break;
        case 0x103:
          sel = sel - (0 < (int)sel);
          break;
        case 0x104:
          if (0 < Param[(int)sel].value) {
            iVar4 = Param[(int)sel].value + -1;
LAB_00102e62:
            Param[(int)sel].value = iVar4;
            paramSync();
            uVar6 = 0xffffffff;
          }
          break;
        case 0x105:
          if (Param[(int)sel].value < 0xff) {
            iVar4 = Param[(int)sel].value + 1;
            goto LAB_00102e62;
          }
          break;
        default:
          if (iVar4 != -1) goto LAB_00102dec;
        }
      }
      tmrWaitForFrame();
      iVar4 = zvgFrameSend();
      if (bVar1) {
        zvgReadMonitorInfo(&ZvgMon);
        Param[0].value = (int)DAT_001060e1;
        Param[1].value = (int)DAT_001060e2;
        Param[6].value = (int)DAT_001060e3;
        Param[7].value = (int)DAT_001060e4;
        Param[2].value = (int)DAT_001060e6;
        Param[3].value = (int)DAT_001060e5;
        Param[4].value = (int)ZvgMon;
        Param[5].value = (int)DAT_001060e7;
        pParamAll(sel);
      }
    } while (iVar4 == 0);
    zvgFrameClose();
    initscr();
  }
  zvgError();
LAB_00102f26:
  endwin();
  zvgFrameClose();
  exit(0);
}

Assistant:

int main( int argc, char *argv[])
{
	uint	err;
	uint	paramsChanged;
	int	cc;
	int	pIdx, o_pIdx, clearCount;

	// Setup the ZVG subsytem, this routine initializes the timers and calibrates any timing
	// needed by the the zvgPort routines.

	err = zvgFrameOpen();

	if (err)
	{	zvgError( err);
		exitProg();
	}

	zvgBanner( ZvgSpeeds, &ZvgID);

	fputs( "\n\nPress any key to continue...", stdout);
	fflush( stdout);

#if defined(WIN32)
#elif defined(linux)

	fgetc( stdin);
	init_zvgtweak();

#else // DOS

	getch();

#endif // OS

	// setup the default screen colors, clear screen and turn off cursor

	textattr( ATTR_DEF);
#if defined(WIN32)
#elif defined(linux)

	initscr();
//!!!	_setcursortype( _NOCURSOR);

#else // DOS

	clrscr();
	_setcursortype( _NOCURSOR);

#endif // OS

	displayMenu();

	err = errOk;

	paramRead();							// move ZVG variables into local variables
	pParamAll( -1);

	// Dump frame over and over to the ZVG while looking for key presses

	tmrSetFrameRate( FRAMERATE);		// set frame rate

	pIdx = 0;
	o_pIdx = -1;
	err = errOk;

	while (err == errOk)
	{
		drawDisplay();

		// if parameter pointer has moved, clear old value and highlight new value

		if (o_pIdx != pIdx)
		{	pParam( Param + pIdx, ATTR_SEL, ' ', ' ');

			// if old index was valid, clear it, otherwise do nothing

			if (o_pIdx != -1)
				pParam( Param + o_pIdx, ATTR_DEF, ' ', ' ');

			o_pIdx = pIdx;
		}

		// check to see if informative message has timed out

		if (clearCount > 0)
		{	clearCount--;

			if (clearCount == 0)
			{	gotoxy( 1, 24);
				clreol();
			}
		}

		// check for a keypress

#if defined(WIN32)
#elif defined(linux)
		// Remember we're in a nodelay state; getch returns immediately.
		cc = getch();
		if (cc != ERR)	// Had a key press?
#else // DOS
		if (kbhit())
#endif // OS
		{
			// read key

#if defined(WIN32)
#elif defined(linux)
#else // DOS
			cc = getkey();
#endif // OS

			switch (cc)
			{
			case K_Right:
				if (Param[pIdx].value < 255)
				{	Param[pIdx].value++;
					paramSync();
					o_pIdx = -1;					// cause value to be updated
				}
				break;

			case K_Left:
				if (Param[pIdx].value > 0)
				{	Param[pIdx].value--;
					paramSync();
					o_pIdx = -1;					// cause value to be updated
				}
				break;

			case K_Down:
				if (pIdx < (sizeof( Param) / sizeof( *Param)) - 1)
					pIdx++;

				break;

			case K_Up:
				if (pIdx > 0)
					pIdx--;

				break;

				// Save the current value in the ZVG, to the ZVG's EEPROM.
				// This allow the parameters to survive a power failure.
				// FYI: There are separate EEPROM locations for each table
				// speed.

			case 'S':
			case 's':
				zvgDmaPutc( zcSAVE_EE);
				pMsg( " Current values saved to EEPROM. ");
				clearCount = FRAMERATE * 4;				// display for 4 seconds
				break;

				// Reload the values from the EEPROM, incase you've screwed
				// something up and want to get back to where you were.

			case 'L':
			case 'l':
				zvgDmaPutc( zcLOAD_EE);
				pMsg( " Monitor values re-loaded from EEPROM. ");
				textattr( ATTR_DEF);
				clearCount = FRAMERATE * 4;				// display for 4 seconds
				paramsChanged = zTrue;						// indicate parameters need reading
				break;

				// Reset the values to the factor default, incase you've *really*
				// screwed something up!  If the values save in EEPROM are
				// screwed up you will have to save these values back to EEPROM
				// if you don't want them reappearing.

			case 'I':
			case 'i':
				zvgDmaPutc( zcRESET_MON);
				pMsg( " Monitor values initialized to factory defaults. ");
				clearCount = FRAMERATE * 4;				// display for 4 seconds
				paramsChanged = zTrue;						// indicate parameters need reading
				break;
			}

			if (cc == 0x1B || cc == 'X' || cc == 'x')
				break;							// if ESC pressed, leave loop
		} // End of check for keyboard input

		// wait for start of next frame

		tmrWaitForFrame();

		err = zvgFrameSend();				// send frame of DMA and swap buffers

		// if parameters were changed, read new parameter into parameter structure

		if (paramsChanged)
		{	zvgReadMonitorInfo( &ZvgMon);	// read info from ZVG
			paramRead();						// update our local database
			pParamAll( pIdx);					// reprint local variables
			paramsChanged = zFalse;
		}
	} // End of while loop

	// restore ZVG stuff

	zvgFrameClose();

	// set back to original video values, clear screen, turn the cursor back on

#if defined(WIN32)
#elif defined(linux)

//!!!	normvideo();
	initscr();
//!!!	_setcursortype( _NORMALCURSOR);

#else // DOS

	normvideo();
	clrscr();
	_setcursortype( _NORMALCURSOR);

#endif // OS

	// if we exited because of an error, print the error.

	if (err)
		zvgError( err);

	exitProg();
	return (0);
}